

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

uint32_t __thiscall
cfd::core::ConfidentialTransaction::GetTxOutIndex
          (ConfidentialTransaction *this,Script *locking_script)

{
  _Alloc_hider _Var1;
  int iVar2;
  CfdException *this_00;
  pointer pCVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  string script;
  string search_str;
  uint32_t local_ac;
  string local_a8;
  string local_88;
  Script local_68;
  
  Script::GetHex_abi_cxx11_(&local_88,locking_script);
  pCVar3 = (this->vout_).
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->vout_).
                          super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) >> 3) *
      -0x42108421 != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      AbstractTxOut::GetLockingScript
                (&local_68,
                 (AbstractTxOut *)((long)&(pCVar3->super_AbstractTxOut)._vptr_AbstractTxOut + lVar4)
                );
      Script::GetHex_abi_cxx11_(&local_a8,&local_68);
      Script::~Script(&local_68);
      _Var1._M_p = local_a8._M_dataplus._M_p;
      if (local_a8._M_string_length == local_88._M_string_length) {
        if (local_a8._M_string_length == 0) {
          bVar6 = true;
          local_ac = (uint32_t)uVar5;
        }
        else {
          iVar2 = bcmp(local_a8._M_dataplus._M_p,local_88._M_dataplus._M_p,local_a8._M_string_length
                      );
          bVar6 = iVar2 == 0;
          if (bVar6) {
            local_ac = (uint32_t)uVar5;
          }
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_a8.field_2) {
        operator_delete(_Var1._M_p);
      }
      if (bVar6) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        return local_ac;
      }
      uVar5 = uVar5 + 1;
      pCVar3 = (this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0xf8;
    } while (uVar5 < (uint)((int)((ulong)((long)(this->vout_).
                                                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pCVar3) >> 3) * -0x42108421));
  }
  local_68._vptr_Script = (_func_int **)0x21f267;
  local_68.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x5c7;
  local_68.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "GetTxOutIndex";
  logger::log<>((CfdSourceLocation *)&local_68,kCfdLogLevelWarning,"locking script is not found.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._vptr_Script =
       (_func_int **)
       ((long)&local_68.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"locking script is not found.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_68);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t ConfidentialTransaction::GetTxOutIndex(
    const Script &locking_script) const {
  std::string search_str = locking_script.GetHex();
  uint32_t index = 0;
  for (; index < static_cast<uint32_t>(vout_.size()); ++index) {
    std::string script = vout_[index].GetLockingScript().GetHex();
    if (script == search_str) {
      return index;
    }
  }
  warn(CFD_LOG_SOURCE, "locking script is not found.");
  throw CfdException(kCfdIllegalArgumentError, "locking script is not found.");
}